

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# responseproxy.cpp
# Opt level: O3

kTRContinueMode __thiscall
trun::TestResponseProxy::AssertError(TestResponseProxy *this,char *exp,char *file,int line)

{
  kTRContinueMode kVar1;
  Config *pCVar2;
  allocator<char> local_62;
  allocator<char> local_61;
  string local_60;
  string local_40;
  
  gnilk::Log::Debug<char_const*,char_const*,int,char_const*>
            (this->pLogger,"Assert Error: %s:%d\t\'%s\'",file,line,exp);
  printf("*** ASSERT ERROR: %s:%d\t\'%s\'\n",file,(ulong)(uint)line,exp);
  this->assertCount = this->assertCount + 1;
  if (this->testResult == kTestResult_Pass) {
    this->testResult = kTestResult_TestFail;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,file,&local_61);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,exp,&local_62);
  trun::AssertError::Add(&this->assertError,kAssert_Error,line,&local_40,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  pCVar2 = Config::Instance();
  kVar1 = kTRContinue;
  if (pCVar2->continueOnAssert == false) {
    pCVar2 = Config::Instance();
    kVar1 = kTRLeave;
    if (pCVar2->testExecutionType == kThreadedWithExit) {
      pthread_exit((void *)0x0);
    }
  }
  return kVar1;
}

Assistant:

kTRContinueMode TestResponseProxy::AssertError(const char *exp, const char *file, const int line) {
    pLogger->Debug("Assert Error: %s:%d\t'%s'", file, line, exp);
    printf("*** ASSERT ERROR: %s:%d\t'%s'\n", file, line, exp);

    this->assertCount++;
    if (testResult < kTestResult_TestFail) {
        testResult = kTestResult_TestFail;
    }
    assertError.Add(AssertError::kAssert_Error, line, file, exp);
    if (Config::Instance().continueOnAssert) {
        return kTRContinueMode::kTRContinue;
    }
    TerminateThreadIfNeeded();
    return kTRContinueMode::kTRLeave;
}